

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::waitForReset
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *pCVar1;
  GLenum GVar2;
  GLsync p_Var3;
  
  pCVar1 = contextReset->m_ptr;
  p_Var3 = (*pCVar1->m_gl->fenceSync)(0x9117,0);
  pCVar1->m_sync = p_Var3;
  GVar2 = (*pCVar1->m_gl->getError)();
  glu::checkError(GVar2,"glFenceSync()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x27f);
  (*contextReset->m_ptr->_vptr_ContextReset[4])();
  pCVar1 = contextReset->m_ptr;
  (*pCVar1->m_gl->finish)();
  GVar2 = (*pCVar1->m_gl->getError)();
  glu::checkError(GVar2,"finish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x279);
  return;
}

Assistant:

virtual void waitForReset (de::SharedPtr<ContextReset>& contextReset)
	{
		contextReset->createSyncObject();
		contextReset->teardown();
		contextReset->finish();
	}